

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::static_getp_packBytes(vm_val_t *retval,uint *pargc)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  CVmMemorySource *this;
  uint argc;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_108 [2];
  long local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  
  if (pargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *pargc;
  }
  if (static_getp_packBytes(vm_val_t*,unsigned_int*)::desc == '\0') {
    static_getp_packBytes();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,pargc,&static_getp_packBytes::desc);
  if (iVar3 == 0) {
    this = (CVmMemorySource *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource(this,0);
    G_err_frame::__tls_init();
    local_100 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_108;
    local_108[0] = _setjmp(&local_f0);
    if (local_108[0] == 0) {
      iVar3 = 0;
      CVmPack::pack(0,argc,(CVmDataSource *)this);
      vVar4 = create_latin1(iVar3,(CVmDataSource *)this);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar4;
    }
    if (-1 < (short)local_108[0]) {
      local_108[0] = local_108[0] | 0x8000;
      (*(this->super_CVmDataSource)._vptr_CVmDataSource[1])(this);
    }
    lVar1 = local_100;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_108[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_f8;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_108[0] & 2) != 0) {
      free(local_f8);
    }
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjString::static_getp_packBytes(VMG_ vm_val_t *retval, uint *pargc)
{
    /* check arguments */
    uint argc = (pargc != 0 ? *pargc : 0);
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, pargc, &desc))
        return TRUE;

    /* set up an in-memory data stream to receive the packed data */
    CVmMemorySource *dst = new CVmMemorySource(0L);

    err_try
    {
        /* do the packing */
        CVmPack::pack(vmg_ 0, argc, dst);

        /* create a string from the byte stream */
        retval->set_obj(create_latin1(vmg_ FALSE, dst));
    }